

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

void xmlFreeTextReader(xmlTextReaderPtr reader)

{
  int local_14;
  int i;
  xmlTextReaderPtr reader_local;
  
  if (reader != (xmlTextReaderPtr)0x0) {
    if (reader->rngSchemas != (xmlRelaxNGPtr)0x0) {
      xmlRelaxNGFree(reader->rngSchemas);
      reader->rngSchemas = (xmlRelaxNGPtr)0x0;
    }
    if (reader->rngValidCtxt != (xmlRelaxNGValidCtxtPtr)0x0) {
      if (reader->rngPreserveCtxt == 0) {
        xmlRelaxNGFreeValidCtxt(reader->rngValidCtxt);
      }
      reader->rngValidCtxt = (xmlRelaxNGValidCtxtPtr)0x0;
    }
    if (reader->xsdPlug != (xmlSchemaSAXPlugPtr)0x0) {
      xmlSchemaSAXUnplug(reader->xsdPlug);
      reader->xsdPlug = (xmlSchemaSAXPlugPtr)0x0;
    }
    if (reader->xsdValidCtxt != (xmlSchemaValidCtxtPtr)0x0) {
      if (reader->xsdPreserveCtxt == 0) {
        xmlSchemaFreeValidCtxt(reader->xsdValidCtxt);
      }
      reader->xsdValidCtxt = (xmlSchemaValidCtxtPtr)0x0;
    }
    if (reader->xsdSchemas != (xmlSchemaPtr)0x0) {
      xmlSchemaFree(reader->xsdSchemas);
      reader->xsdSchemas = (xmlSchemaPtr)0x0;
    }
    if (reader->xincctxt != (xmlXIncludeCtxtPtr)0x0) {
      xmlXIncludeFreeContext(reader->xincctxt);
    }
    if (reader->patternTab != (xmlPatternPtr *)0x0) {
      for (local_14 = 0; local_14 < reader->patternNr; local_14 = local_14 + 1) {
        if (reader->patternTab[local_14] != (xmlPatternPtr)0x0) {
          xmlFreePattern(reader->patternTab[local_14]);
        }
      }
      (*xmlFree)(reader->patternTab);
    }
    if (reader->mode != 4) {
      xmlTextReaderClose(reader);
    }
    if (reader->ctxt != (xmlParserCtxtPtr)0x0) {
      if (reader->dict == reader->ctxt->dict) {
        reader->dict = (xmlDictPtr)0x0;
      }
      if ((reader->allocs & 2U) != 0) {
        xmlFreeParserCtxt(reader->ctxt);
      }
    }
    if (reader->sax != (xmlSAXHandlerPtr)0x0) {
      (*xmlFree)(reader->sax);
    }
    if (reader->buffer != (xmlBufPtr)0x0) {
      xmlBufFree(reader->buffer);
    }
    if (reader->entTab != (xmlNodePtr *)0x0) {
      (*xmlFree)(reader->entTab);
    }
    if (reader->dict != (xmlDictPtr)0x0) {
      xmlDictFree(reader->dict);
    }
    (*xmlFree)(reader);
  }
  return;
}

Assistant:

void
xmlFreeTextReader(xmlTextReaderPtr reader) {
    if (reader == NULL)
	return;
#ifdef LIBXML_SCHEMAS_ENABLED
    if (reader->rngSchemas != NULL) {
	xmlRelaxNGFree(reader->rngSchemas);
	reader->rngSchemas = NULL;
    }
    if (reader->rngValidCtxt != NULL) {
	if (! reader->rngPreserveCtxt)
	    xmlRelaxNGFreeValidCtxt(reader->rngValidCtxt);
	reader->rngValidCtxt = NULL;
    }
    if (reader->xsdPlug != NULL) {
	xmlSchemaSAXUnplug(reader->xsdPlug);
	reader->xsdPlug = NULL;
    }
    if (reader->xsdValidCtxt != NULL) {
	if (! reader->xsdPreserveCtxt)
	    xmlSchemaFreeValidCtxt(reader->xsdValidCtxt);
	reader->xsdValidCtxt = NULL;
    }
    if (reader->xsdSchemas != NULL) {
	xmlSchemaFree(reader->xsdSchemas);
	reader->xsdSchemas = NULL;
    }
#endif
#ifdef LIBXML_XINCLUDE_ENABLED
    if (reader->xincctxt != NULL)
	xmlXIncludeFreeContext(reader->xincctxt);
#endif
#ifdef LIBXML_PATTERN_ENABLED
    if (reader->patternTab != NULL) {
        int i;
	for (i = 0;i < reader->patternNr;i++) {
	    if (reader->patternTab[i] != NULL)
	        xmlFreePattern(reader->patternTab[i]);
	}
	xmlFree(reader->patternTab);
    }
#endif
    if (reader->mode != XML_TEXTREADER_MODE_CLOSED)
        xmlTextReaderClose(reader);
    if (reader->ctxt != NULL) {
        if (reader->dict == reader->ctxt->dict)
	    reader->dict = NULL;
	if (reader->allocs & XML_TEXTREADER_CTXT)
	    xmlFreeParserCtxt(reader->ctxt);
    }
    if (reader->sax != NULL)
	xmlFree(reader->sax);
    if (reader->buffer != NULL)
        xmlBufFree(reader->buffer);
    if (reader->entTab != NULL)
	xmlFree(reader->entTab);
    if (reader->dict != NULL)
        xmlDictFree(reader->dict);
    xmlFree(reader);
}